

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.h
# Opt level: O1

void __thiscall arangodb::velocypack::Builder::appendInt(Builder *this,int64_t v,uint8_t base)

{
  ValueLength *pVVar1;
  ValueLength VVar2;
  bool bVar3;
  ulong uVar4;
  byte bVar5;
  
  bVar5 = 1;
  if ((char)v != v) {
    uVar4 = v >> 0x3f ^ v;
    do {
      bVar5 = bVar5 + 1;
      bVar3 = 0x7fff < uVar4;
      uVar4 = uVar4 >> 8;
    } while (bVar3);
  }
  if (bVar5 != 8) {
    v = v + (v >> 0x3f & 2L << (bVar5 * '\b' - 1 & 0x3f));
  }
  reserve(this,(ulong)(bVar5 + 1));
  VVar2 = this->_pos;
  this->_pos = VVar2 + 1;
  this->_start[VVar2] = bVar5 + base;
  pVVar1 = &this->_bufferPtr->_size;
  *pVVar1 = *pVVar1 + 1;
  do {
    VVar2 = this->_pos;
    this->_pos = VVar2 + 1;
    this->_start[VVar2] = (uint8_t)v;
    pVVar1 = &this->_bufferPtr->_size;
    *pVVar1 = *pVVar1 + 1;
    v = (ulong)v >> 8;
    bVar5 = bVar5 - 1;
  } while (bVar5 != 0);
  return;
}

Assistant:

void appendInt(int64_t v, uint8_t base) {
    uint8_t vSize = intLength(v);
    uint64_t x;
    if (vSize == 8) {
      x = toUInt64(v);
    } else {
      int64_t shift = 1LL << (vSize * 8 - 1);  // will never overflow!
      x = v >= 0 ? static_cast<uint64_t>(v)
                 : static_cast<uint64_t>(v + shift) + shift;
    }
    reserve(1 + vSize);
    appendByteUnchecked(base + vSize);
    while (vSize-- > 0) {
      appendByteUnchecked(x & 0xff);
      x >>= 8;
    }
  }